

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SiameseEncoder.cpp
# Opt level: O1

void __thiscall siamese::EncoderPacketWindow::StartNewWindow(EncoderPacketWindow *this,uint column)

{
  ostringstream *this_00;
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  OutputWorker *this_01;
  undefined1 local_198 [392];
  
  this->ColumnStart = column & 0xfffffff8;
  this->Count = (column & 7) + 1;
  auVar1 = vpshufb_avx(ZEXT416(column & 7),_DAT_001b7b70);
  this->LongestPacket = auVar1._0_4_;
  this->FirstUnremovedElement = auVar1._4_4_;
  this->SumStartElement = auVar1._8_4_;
  this->SumEndElement = auVar1._12_4_;
  auVar2 = vpmovsxwd_avx2(_DAT_001b7b80);
  vpscatterdd_avx512vl
            (ZEXT832(this) + ZEXT832(0x158) + auVar2,0xffff,ZEXT1632((undefined1  [16])0x0));
  if (DAT_0020d7e8 < 3) {
    this_00 = (ostringstream *)(local_198 + 0x10);
    local_198._0_8_ = Logger;
    local_198._8_4_ = Info;
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,DAT_0020d818,DAT_0020d820)
    ;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,">>> Starting a new window from column ",0x26);
    std::ostream::_M_insert<unsigned_long>((ulong)this_00);
    this_01 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(this_01,(LogStringBuffer *)local_198);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base((ios_base *)(local_198 + 0x80));
  }
  return;
}

Assistant:

void EncoderPacketWindow::StartNewWindow(unsigned column)
{
    // Maintain the invariant that element % 8 == column % 8 by skipping some
    const unsigned element = column % kColumnLaneCount;
    ColumnStart            = column - element;
    SIAMESE_DEBUG_ASSERT(column >= element && ColumnStart < kColumnPeriod);
    SumStartElement        = element;
    SumEndElement          = element;
    FirstUnremovedElement  = element;
    Count                  = element + 1;

    // Reset longest packet
    LongestPacket = 0;
    for (unsigned laneIndex = 0; laneIndex < kColumnLaneCount; ++laneIndex) {
        Lanes[laneIndex].LongestPacket = 0;
    }

    Logger.Info(">>> Starting a new window from column ", ColumnStart);
}